

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrio.c
# Opt level: O0

void png_default_read_data(png_structp png_ptr,png_bytep data,png_size_t length)

{
  size_t sVar1;
  png_size_t check;
  png_size_t length_local;
  png_bytep data_local;
  png_structp png_ptr_local;
  
  if ((png_ptr != (png_structp)0x0) &&
     (sVar1 = fread(data,1,length,(FILE *)png_ptr->io_ptr), sVar1 != length)) {
    png_error(png_ptr,"Read Error");
  }
  return;
}

Assistant:

void PNGCBAPI
png_default_read_data(png_structp png_ptr, png_bytep data, png_size_t length)
{
   png_size_t check;

   if (png_ptr == NULL)
      return;

   /* fread() returns 0 on error, so it is OK to store this in a png_size_t
    * instead of an int, which is what fread() actually returns.
    */
   check = fread(data, 1, length, png_voidcast(png_FILE_p, png_ptr->io_ptr));

   if (check != length)
      png_error(png_ptr, "Read Error");
}